

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PagePool.h
# Opt level: O0

void __thiscall Memory::PagePool::ReleaseFreePages(PagePool *this)

{
  PagePoolFreePage *this_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  PagePoolFreePage *page;
  PagePool *this_local;
  
  do {
    if (this->freePageList == (PagePoolFreePage *)0x0) {
      return;
    }
    this_00 = this->freePageList;
    bVar2 = PagePoolPage::IsReserved(&this_00->super_PagePoolPage);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PagePool.h"
                         ,0x93,"(!page->IsReserved())","!page->IsReserved()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    this->freePageList = this->freePageList->nextFreePage;
    PagePoolPage::Free(&this_00->super_PagePoolPage);
  } while( true );
}

Assistant:

void ReleaseFreePages()
    {
        while (freePageList != nullptr)
        {
            PagePoolFreePage * page = freePageList;
            Assert(!page->IsReserved());
            freePageList = freePageList->nextFreePage;
            page->Free();
        }
    }